

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O0

string * pystring::ljust(string *__return_storage_ptr__,string *str,int width)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_type __n;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  size_type len;
  string *psStack_18;
  int width_local;
  string *str_local;
  
  len._4_4_ = width;
  psStack_18 = str;
  str_local = __return_storage_ptr__;
  local_28 = std::__cxx11::string::size();
  __lhs = psStack_18;
  if ((int)local_28 < len._4_4_) {
    __n = len._4_4_ - local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__n,' ',&local_49);
    std::operator+(__return_storage_ptr__,__lhs,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psStack_18);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ljust( const std::string & str, int width )
    {
        std::string::size_type len = str.size();
        if ( (( int ) len ) >= width ) return str;
        return str + std::string( width - len, ' ' );
    }